

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O0

bool Fix_Shift_For_Code(short code,bool old_shift)

{
  undefined1 local_9;
  bool old_shift_local;
  short code_local;
  
  if ((code < 0x41) || (0x5a < code)) {
    if (((((0x20 < code) && (code < 0x30)) || ((0x39 < code && (code < 0x41)))) ||
        ((0x5a < code && (code < 0x61)))) || ((local_9 = old_shift, 0x7a < code && (code < 0x7f))))
    {
      local_9 = 0;
    }
  }
  else {
    local_9 = 1;
  }
  return (bool)local_9;
}

Assistant:

bool
Fix_Shift_For_Code(short code, bool old_shift)
{
  // if uppercase letter, then shift should be true
  if ((code >= 'A') && (code <= 'Z'))
    return true;
  // if a special character, don't allow shift
  else if (((code > ' ') && (code < '0')) || ((code > '9') && (code < 'A')) ||
           ((code > 'Z') && (code < 'a')) || ((code > 'z') && (code <= '~')))
    return false;
  else
    return old_shift;
}